

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fms.c
# Opt level: O0

int FmsDomainSetNumEntities
              (FmsDomain domain,FmsEntityType type,FmsIntType id_store_type,FmsInt num_ents)

{
  size_t sVar1;
  long lVar2;
  size_t __size;
  void *pvVar3;
  FmsInt FVar4;
  long in_RCX;
  uint in_EDX;
  uint in_ESI;
  long *in_RDI;
  FmsInt i;
  FmsOrientation *orientations;
  FmsInt tot_sides;
  FmsInt num_sides;
  size_t sizeof_side_ids;
  ulong local_48;
  int local_4;
  
  if (in_RDI == (long *)0x0) {
    local_4 = 1;
  }
  else if (in_ESI < 8) {
    if (in_ESI == 0) {
      *in_RDI = in_RCX;
      if (in_RDI[0x26] == 0x7f) {
        in_RDI[0x26] = 0;
      }
      local_4 = 0;
    }
    else if (in_EDX < 8) {
      sVar1 = FmsIntTypeSize[in_EDX];
      FVar4 = FmsEntityNumSides[in_ESI];
      in_RDI[in_ESI] = 0;
      in_RDI[(ulong)in_ESI + 8] = 0;
      free((void *)in_RDI[(ulong)in_ESI + 0x1c]);
      free((void *)in_RDI[(ulong)in_ESI + 0x14]);
      if (in_RCX == 0) {
        in_RDI[(ulong)in_ESI + 0x14] = 0;
        in_RDI[(ulong)in_ESI + 0x1c] = 0;
      }
      else {
        __size = in_RCX * FVar4;
        pvVar3 = malloc(__size * sVar1);
        in_RDI[(ulong)in_ESI + 0x14] = (long)pvVar3;
        if (in_RDI[(ulong)in_ESI + 0x14] == 0) {
          in_RDI[(ulong)in_ESI + 0x1c] = 0;
          return 4;
        }
        pvVar3 = malloc(__size);
        in_RDI[(ulong)in_ESI + 0x1c] = (long)pvVar3;
        if (in_RDI[(ulong)in_ESI + 0x1c] == 0) {
          free((void *)in_RDI[(ulong)in_ESI + 0x14]);
          in_RDI[(ulong)in_ESI + 0x14] = 0;
          return 4;
        }
        lVar2 = in_RDI[(ulong)in_ESI + 0x1c];
        for (local_48 = 0; local_48 < __size; local_48 = local_48 + 1) {
          *(undefined1 *)(lVar2 + local_48) = 0xff;
        }
      }
      in_RDI[(ulong)in_ESI + 8] = in_RCX;
      *(uint *)((long)in_RDI + (ulong)in_ESI * 4 + 0x80) = in_EDX;
      if (in_RDI[0x26] == 0x7f) {
        in_RDI[0x26] = FmsEntityDim[in_ESI];
      }
      else {
        FVar4 = FmsIntMax(in_RDI[0x26],FmsEntityDim[in_ESI]);
        in_RDI[0x26] = FVar4;
      }
      local_4 = 0;
    }
    else {
      local_4 = 3;
    }
  }
  else {
    local_4 = 2;
  }
  return local_4;
}

Assistant:

int FmsDomainSetNumEntities(FmsDomain domain, FmsEntityType type,
                            FmsIntType id_store_type, FmsInt num_ents) {
  if (!domain) { E_RETURN(1); }
  if (type >= FMS_NUM_ENTITY_TYPES) { E_RETURN(2); }
  if (type == FMS_VERTEX) {
    domain->num_entities[type] = num_ents;
    if (domain->dim == FMS_INVALID_DIM) { domain->dim = 0; }
    return 0;
  }
  if (id_store_type >= FMS_NUM_INT_TYPES) { E_RETURN(3); }
  const size_t sizeof_side_ids = FmsIntTypeSize[id_store_type];
  const FmsInt num_sides = FmsEntityNumSides[type];
  domain->num_entities[type] = 0;
  domain->entities_caps[type] = 0;
  free(domain->orientations[type]);
  free(domain->entities[type]);
  if (num_ents != 0) {
    FmsInt tot_sides = num_ents*num_sides;
    domain->entities[type] = malloc(tot_sides*sizeof_side_ids);
    if (domain->entities[type] == NULL) {
      domain->orientations[type] = NULL;
      E_RETURN(4);
    }
    domain->orientations[type] = malloc(tot_sides*sizeof(FmsOrientation));
    if (domain->orientations[type] == NULL) {
      free(domain->entities[type]);
      domain->entities[type] = NULL;
      E_RETURN(4);
    }
    FmsOrientation *orientations = domain->orientations[type];
    for (FmsInt i = 0; i < tot_sides; i++) {
      orientations[i] = FMS_ORIENTATION_UNKNOWN;
    }
  } else {
    domain->entities[type] = NULL;
    domain->orientations[type] = NULL;
  }
  domain->entities_caps[type] = num_ents;
  domain->side_ids_type[type] = id_store_type;
  if (domain->dim == FMS_INVALID_DIM) {
    domain->dim = FmsEntityDim[type];
  } else {
    domain->dim = FmsIntMax(domain->dim, FmsEntityDim[type]);
  }
  return 0;
}